

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_fill_Test::~ByteBufferTest_test_fill_Test
          (ByteBufferTest_test_fill_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ByteBufferTest, test_fill)
{
    ByteBuffer byte_buffer(12);
    std::string input = "abc";
    byte_buffer.WriteBytes((unsigned char *) &input[0], 3);
    EXPECT_EQ('a', byte_buffer.GetNextByte());
    EXPECT_EQ('b', byte_buffer.GetNextByte());
    EXPECT_EQ('c', byte_buffer.GetNextByte());
    byte_buffer.Fill(0);
    EXPECT_EQ(0, byte_buffer.GetNextByte());
    EXPECT_EQ(0, byte_buffer.GetNextByte());
    EXPECT_EQ(0, byte_buffer.GetNextByte());
}